

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnBrExpr(BinaryReaderInterp *this,Index depth)

{
  Index index;
  bool bVar1;
  Location local_98;
  Var local_78;
  Enum local_2c;
  Enum local_28;
  Index local_24;
  Index local_20;
  Index keep_count;
  Index drop_count;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  keep_count = depth;
  _drop_count = this;
  local_28 = (Enum)GetBrDropKeepCount(this,depth,&local_20,&local_24);
  bVar1 = Failed((Result)local_28);
  index = keep_count;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Location::Location(&local_98);
    Var::Var(&local_78,index,&local_98);
    local_2c = (Enum)SharedValidator::OnBr
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_78
                               );
    bVar1 = Failed((Result)local_2c);
    Var::~Var(&local_78);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      EmitBr(this,keep_count,local_20,local_24);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnBrExpr(Index depth) {
  Index drop_count, keep_count;
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  CHECK_RESULT(validator_.OnBr(loc, Var(depth)));
  EmitBr(depth, drop_count, keep_count);
  return Result::Ok;
}